

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitTestCaseData::appendSubcaseNamesToLastTestcase
          (JUnitTestCaseData *this,
          vector<doctest::String,_std::allocator<doctest::String>_> *nameStack)

{
  pointer pSVar1;
  uint uVar2;
  pointer __rhs;
  pointer pSVar3;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = (nameStack->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (nameStack->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                _M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    if ((pSVar3->field_0).buf[0x17] < '\0') {
      uVar2 = (pSVar3->field_0).data.size;
    }
    else {
      uVar2 = 0x17 - ((byte)(pSVar3->field_0).buf[0x17] & 0x1f);
    }
    if (uVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/",&local_71);
      __rhs = pSVar3;
      if ((pSVar3->field_0).buf[0x17] < '\0') {
        __rhs = (pointer)(pSVar3->field_0).data.ptr;
      }
      std::operator+(&local_50,&local_70,(char *)__rhs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&(this->testcases).
                  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].name,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void appendSubcaseNamesToLastTestcase(std::vector<String> nameStack) {
                for(auto& curr: nameStack)
                    if(curr.size())
                        testcases.back().name += std::string("/") + curr.c_str();
            }